

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Vgm_File::load_(Vgm_File *this,Data_Reader *in)

{
  blargg_ulong bVar1;
  blargg_err_t pcVar2;
  long lVar3;
  uchar *puVar4;
  size_t sVar5;
  long *in_RSI;
  long in_RDI;
  blargg_err_t blargg_return_err__5;
  blargg_err_t blargg_return_err__4;
  long gd3_size;
  blargg_err_t blargg_return_err__3;
  blargg_err_t blargg_return_err__2;
  byte_ gd3_h [12];
  long remain;
  long gd3_offset;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  long file_size;
  size_t in_stack_ffffffffffffff70;
  blargg_vector<unsigned_char> *in_stack_ffffffffffffff78;
  undefined1 local_4c [12];
  long local_40;
  ulong local_38;
  blargg_err_t local_30;
  blargg_err_t local_28;
  long local_20;
  long *local_18;
  blargg_err_t local_8;
  
  local_18 = in_RSI;
  local_20 = (**(code **)(*in_RSI + 0x20))();
  if (local_20 < 0x41) {
    local_8 = "Wrong file type for this emulator";
  }
  else {
    local_28 = (blargg_err_t)(**(code **)(*local_18 + 0x18))(local_18,in_RDI + 0x1a0,0x40);
    local_8 = local_28;
    if ((local_28 == (blargg_err_t)0x0) &&
       (local_30 = check_vgm_header((header_t *)(in_RDI + 0x1a0)), local_8 = local_30,
       local_30 == (blargg_err_t)0x0)) {
      bVar1 = get_le32((void *)(in_RDI + 0x1b4));
      local_38 = (ulong)(bVar1 - 0x2c);
      local_40 = (local_20 + -0x40) - local_38;
      if ((local_38 != 0) && (0xb < local_40)) {
        pcVar2 = (blargg_err_t)(**(code **)(*local_18 + 0x28))(local_18,local_38);
        if (pcVar2 != (blargg_err_t)0x0) {
          return pcVar2;
        }
        pcVar2 = (blargg_err_t)(**(code **)(*local_18 + 0x18))(local_18,local_4c,0xc);
        if (pcVar2 != (blargg_err_t)0x0) {
          return pcVar2;
        }
        lVar3 = check_gd3_header((byte_ *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        if (lVar3 != 0) {
          pcVar2 = blargg_vector<unsigned_char>::resize
                             (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          if (pcVar2 != (blargg_err_t)0x0) {
            return pcVar2;
          }
          puVar4 = blargg_vector<unsigned_char>::begin
                             ((blargg_vector<unsigned_char> *)(in_RDI + 0x1e0));
          sVar5 = blargg_vector<unsigned_char>::size
                            ((blargg_vector<unsigned_char> *)(in_RDI + 0x1e0));
          pcVar2 = (blargg_err_t)(**(code **)(*local_18 + 0x18))(local_18,puVar4,sVar5);
          if (pcVar2 != (blargg_err_t)0x0) {
            return pcVar2;
          }
        }
      }
      local_8 = (blargg_err_t)0x0;
    }
  }
  return local_8;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		long file_size = in.remain();
		if ( file_size <= Vgm_Emu::header_size )
			return gme_wrong_file_type;
		
		RETURN_ERR( in.read( &h, Vgm_Emu::header_size ) );
		RETURN_ERR( check_vgm_header( h ) );
		
		long gd3_offset = get_le32( h.gd3_offset ) - 0x2C;
		long remain = file_size - Vgm_Emu::header_size - gd3_offset;
		byte gd3_h [gd3_header_size];
		if ( gd3_offset > 0 && remain >= gd3_header_size )
		{
			RETURN_ERR( in.skip( gd3_offset ) );
			RETURN_ERR( in.read( gd3_h, sizeof gd3_h ) );
			long gd3_size = check_gd3_header( gd3_h, remain );
			if ( gd3_size )
			{
				RETURN_ERR( gd3.resize( gd3_size ) );
				RETURN_ERR( in.read( gd3.begin(), (long)gd3.size() ) );
			}
		}
		return 0;
	}